

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock_setup.cpp
# Opt level: O3

VulkanMock * get_and_setup_default(void)

{
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *this;
  pointer *ppVVar1;
  VulkanMock *mock;
  iterator iVar2;
  VkExtensionProperties ext_props;
  VkExtensionProperties local_138;
  
  mock = (VulkanMock *)get_vulkan_mock();
  this = &mock->instance_extensions;
  memset(local_138.extensionName + 0xf,0,0xf5);
  builtin_strncpy(local_138.extensionName,"VK_KHR_surface",0xf);
  iVar2._M_current =
       (mock->instance_extensions).
       super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (mock->instance_extensions).
      super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
    _M_realloc_insert<VkExtensionProperties>(this,iVar2,&local_138);
    iVar2._M_current =
         (mock->instance_extensions).
         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    memcpy(iVar2._M_current,&local_138,0x104);
    iVar2._M_current =
         (mock->instance_extensions).
         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (mock->instance_extensions).
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  memset(local_138.extensionName + 0x13,0,0xf1);
  builtin_strncpy(local_138.extensionName,"VK_KHR_xcb_surface",0x13);
  if (iVar2._M_current ==
      (mock->instance_extensions).
      super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
    _M_realloc_insert<VkExtensionProperties>(this,iVar2,&local_138);
    iVar2._M_current =
         (mock->instance_extensions).
         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    memcpy(iVar2._M_current,&local_138,0x104);
    iVar2._M_current =
         (mock->instance_extensions).
         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (mock->instance_extensions).
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  memset(local_138.extensionName + 0x14,0,0xf0);
  builtin_strncpy(local_138.extensionName,"VK_KHR_xlib_surface",0x13);
  local_138.extensionName._19_4_ = local_138.extensionName._19_4_ & 0xffffff00;
  if (iVar2._M_current ==
      (mock->instance_extensions).
      super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
    _M_realloc_insert<VkExtensionProperties>(this,iVar2,&local_138);
    iVar2._M_current =
         (mock->instance_extensions).
         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    memcpy(iVar2._M_current,&local_138,0x104);
    iVar2._M_current =
         (mock->instance_extensions).
         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (mock->instance_extensions).
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  memset(local_138.extensionName + 0x17,0,0xed);
  builtin_strncpy(local_138.extensionName + 0x13,"ace",4);
  builtin_strncpy(local_138.extensionName,"VK_KHR_wayland_surf",0x13);
  if (iVar2._M_current ==
      (mock->instance_extensions).
      super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
    _M_realloc_insert<VkExtensionProperties>(this,iVar2,&local_138);
    iVar2._M_current =
         (mock->instance_extensions).
         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    memcpy(iVar2._M_current,&local_138,0x104);
    iVar2._M_current =
         (mock->instance_extensions).
         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (mock->instance_extensions).
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  memset(local_138.extensionName + 0x13,0,0xf1);
  builtin_strncpy(local_138.extensionName,"VK_EXT_debug_utils",0x13);
  if (iVar2._M_current ==
      (mock->instance_extensions).
      super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
    _M_realloc_insert<VkExtensionProperties>(this,iVar2,&local_138);
  }
  else {
    memcpy(iVar2._M_current,&local_138,0x104);
    ppVVar1 = &(mock->instance_extensions).
               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  add_basic_physical_device(mock);
  return mock;
}

Assistant:

VulkanMock& get_and_setup_default() {
    VulkanMock& mock = *get_vulkan_mock();
    mock.instance_extensions.push_back(get_extension_properties(VK_KHR_SURFACE_EXTENSION_NAME));
#if defined(_WIN32)
    mock.instance_extensions.push_back(get_extension_properties("VK_KHR_win32_surface"));
#elif defined(__ANDROID__)
    mock.instance_extensions.push_back(get_extension_properties("VK_KHR_android_surface"));
#elif defined(_DIRECT2DISPLAY)
    mock.instance_extensions.push_back(get_extension_properties("VK_KHR_display"));
#elif defined(__linux__) || defined(__FreeBSD__)
    mock.instance_extensions.push_back(get_extension_properties("VK_KHR_xcb_surface"));
    mock.instance_extensions.push_back(get_extension_properties("VK_KHR_xlib_surface"));
    mock.instance_extensions.push_back(get_extension_properties("VK_KHR_wayland_surface"));
#elif defined(__APPLE__)
    mock.instance_extensions.push_back(get_extension_properties("VK_EXT_metal_surface"));
#endif
    mock.instance_extensions.push_back(get_extension_properties(VK_EXT_DEBUG_UTILS_EXTENSION_NAME));
    add_basic_physical_device(mock);
    return mock;
}